

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_pss.cc
# Opt level: O0

X509_ALGOR * rsa_mgf1_decode(X509_ALGOR *alg)

{
  int iVar1;
  uchar *puStack_20;
  int plen;
  uint8_t *p;
  X509_ALGOR *alg_local;
  
  p = (uint8_t *)alg;
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)alg->algorithm);
  if (((iVar1 == 0x38f) && (*(long *)(p + 8) != 0)) && (**(int **)(p + 8) == 0x10)) {
    puStack_20 = *(uchar **)(*(long *)(*(long *)(p + 8) + 8) + 8);
    alg_local = (X509_ALGOR *)
                d2i_X509_ALGOR((X509_ALGOR **)0x0,&stack0xffffffffffffffe0,
                               (long)**(int **)(*(long *)(p + 8) + 8));
  }
  else {
    alg_local = (X509_ALGOR *)0x0;
  }
  return alg_local;
}

Assistant:

static X509_ALGOR *rsa_mgf1_decode(const X509_ALGOR *alg) {
  if (OBJ_obj2nid(alg->algorithm) != NID_mgf1 || alg->parameter == NULL ||
      alg->parameter->type != V_ASN1_SEQUENCE) {
    return NULL;
  }

  const uint8_t *p = alg->parameter->value.sequence->data;
  int plen = alg->parameter->value.sequence->length;
  return d2i_X509_ALGOR(NULL, &p, plen);
}